

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_2,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<double,_2,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  uint uVar10;
  double *integrationTmp;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar11 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
  pdVar7 = (this->super_BeagleCPUImpl<double,_2,_0>).gCategoryWeights[categoryWeightsIndex];
  pdVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).gPartials[bufferIndex];
  integrationTmp = (this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp;
  uVar11 = ~((int)uVar11 >> 0x1f) & uVar11;
  uVar13 = 0;
  dVar1 = *pdVar7;
  uVar10 = uVar11;
  while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
    integrationTmp[uVar13] = dVar1 * pdVar8[uVar13];
    integrationTmp[uVar13 + 1] = dVar1 * pdVar8[uVar13 + 1];
    integrationTmp[uVar13 + 2] = dVar1 * pdVar8[uVar13 + 2];
    integrationTmp[uVar13 + 3] = dVar1 * pdVar8[uVar13 + 3];
    uVar13 = uVar13 + 4;
  }
  iVar9 = (this->super_BeagleCPUImpl<double,_2,_0>).kExtraPatterns;
  iVar6 = (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
  for (lVar14 = 1; lVar14 < iVar6; lVar14 = lVar14 + 1) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pdVar7[lVar14];
    integrationTmp = (this->super_BeagleCPUImpl<double,_2,_0>).integrationTmp;
    iVar12 = (int)uVar13;
    lVar15 = 0;
    uVar10 = uVar11;
    while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = pdVar8[iVar12 + lVar15];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = integrationTmp[lVar15];
      auVar2 = vfmadd213sd_fma(auVar18,auVar17,auVar2);
      integrationTmp[lVar15] = auVar2._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = pdVar8[(long)iVar12 + lVar15 + 1];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = integrationTmp[lVar15 + 1];
      auVar2 = vfmadd213sd_fma(auVar19,auVar17,auVar3);
      integrationTmp[lVar15 + 1] = auVar2._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = pdVar8[(long)iVar12 + lVar15 + 2];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = integrationTmp[lVar15 + 2];
      auVar2 = vfmadd213sd_fma(auVar20,auVar17,auVar4);
      integrationTmp[lVar15 + 2] = auVar2._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = pdVar8[(long)iVar12 + lVar15 + 3];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = integrationTmp[lVar15 + 3];
      auVar2 = vfmadd213sd_fma(auVar21,auVar17,auVar5);
      integrationTmp[lVar15 + 3] = auVar2._0_8_;
      lVar15 = lVar15 + 4;
    }
    uVar13 = (ulong)(uint)((int)lVar15 + iVar12 + iVar9 * 4);
  }
  iVar9 = integrateOutStatesAndScale
                    (this,integrationTmp,stateFrequenciesIndex,scalingFactorsIndex,
                     outSumLogLikelihood);
  return iVar9;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}